

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxOut
          (ConfidentialTransaction *this,Amount *value,ConfidentialAssetId *asset,
          Script *locking_script)

{
  uint32_t uVar1;
  ByteData local_80;
  ConfidentialNonce local_68;
  ByteData local_40;
  
  ConfidentialNonce::ConfidentialNonce(&local_68);
  ByteData::ByteData(&local_80);
  ByteData::ByteData(&local_40);
  uVar1 = AddTxOut(this,value,asset,locking_script,&local_68,&local_80,&local_40);
  if (local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_68._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_0025afc8;
  if (local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

uint32_t ConfidentialTransaction::AddTxOut(
    const Amount &value, const ConfidentialAssetId &asset,
    const Script &locking_script) {
  return AddTxOut(
      value, asset, locking_script, ConfidentialNonce(), ByteData(),
      ByteData());
}